

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O2

Matcher<const_std::pair<phmap::priv::NonStandardLayout,_int>_&> *
testing::internal::
MatcherCastImpl<const_std::pair<phmap::priv::NonStandardLayout,_int>_&,_std::pair<const_phmap::priv::NonStandardLayout,_int>_>
::CastImpl(Matcher<const_std::pair<phmap::priv::NonStandardLayout,_int>_&> *__return_storage_ptr__,
          pair<const_phmap::priv::NonStandardLayout,_int> *value)

{
  pair<phmap::priv::NonStandardLayout,_int> local_40;
  
  std::pair<phmap::priv::NonStandardLayout,_int>::
  pair<const_phmap::priv::NonStandardLayout,_int,_true>(&local_40,value);
  Matcher<const_std::pair<phmap::priv::NonStandardLayout,_int>_&>::Matcher
            (__return_storage_ptr__,&local_40);
  phmap::priv::NonStandardLayout::~NonStandardLayout(&local_40.first);
  return __return_storage_ptr__;
}

Assistant:

static Matcher<T> CastImpl(const M& value,
                             std::false_type /* convertible_to_matcher */,
                             std::true_type /* convertible_to_T */) {
    return Matcher<T>(ImplicitCast_<T>(value));
  }